

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Builder::Builder(Builder *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  arena_type *this_00;
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *this_01;
  size_type in_stack_ffffffffffffffe8;
  _Tp_alloc_type in_stack_fffffffffffffff0;
  
  std::make_shared<arangodb::velocypack::Buffer<unsigned_char>>();
  peVar1 = std::
           __shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::
           get(in_RDI);
  in_RDI[1]._M_ptr = peVar1;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           Buffer<unsigned_char>::data(in_RDI[1]._M_ptr);
  in_RDI[1]._M_refcount._M_pi = p_Var2;
  in_RDI[2]._M_ptr = (element_type *)0x0;
  this_00 = (arena_type *)&in_RDI[2]._M_refcount;
  arena<64UL,_8UL>::arena(this_00);
  this_01 = (vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
             *)&stack0xfffffffffffffff0;
  short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>::short_alloc
            ((short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL> *)this_01,this_00)
  ;
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::vector(this_01,(allocator_type *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x11161b);
  *(undefined1 *)&in_RDI[10]._M_refcount._M_pi = 0;
  in_RDI[0xb]._M_ptr = (element_type *)&Options::Defaults;
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::reserve((vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
             *)in_stack_fffffffffffffff0.a_,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

Builder::Builder()
    : _buffer(std::make_shared<Buffer<uint8_t>>()),
      _bufferPtr(_buffer.get()),
      _start(_bufferPtr->data()),
      _pos(0),
      _arena(),
      _stack(_arena),
      _keyWritten(false),
      options(&Options::Defaults) {
  // do a full initial allocation in the arena, so we can maximize its usage
  _stack.reserve(arenaSize / sizeof(decltype(_stack)::value_type));
}